

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_merging.h
# Opt level: O2

void __thiscall
shift_window_transformer::PatchMerging<float>::forward
          (PatchMerging<float> *this,Tensor<float> *input,Tensor<float> *output)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  pointer pfVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  int x;
  ulong uVar19;
  int iVar20;
  ulong uVar21;
  int local_b8;
  int local_b4;
  int local_74;
  int local_70;
  int local_6c;
  Tensor<float> tmp;
  
  puVar5 = (uint *)(input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
  uVar1 = *puVar5;
  uVar2 = puVar5[1];
  uVar3 = puVar5[2];
  iVar14 = (int)uVar2 / this->downscaling_factor;
  iVar20 = (int)uVar3 / this->downscaling_factor;
  tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  tmp.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tmp.shape.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  tmp.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tmp.super_vector<float,_std::allocator<float>_>.super__Vector_base<float,_std::allocator<float>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize
            (&tmp.super_vector<float,_std::allocator<float>_>,
             (long)(input->super_vector<float,_std::allocator<float>_>).
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_finish -
             (long)(input->super_vector<float,_std::allocator<float>_>).
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start >> 2);
  local_6c = *(input->shape).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start * this->downscaling_factor * this->downscaling_factor
  ;
  local_74 = iVar14;
  local_70 = iVar20;
  std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)&tmp.shape,&local_74);
  iVar9 = 0;
  if (0 < iVar20) {
    iVar9 = iVar20;
  }
  iVar8 = 0;
  if (iVar14 < 1) {
    iVar14 = 0;
  }
  uVar10 = 0;
  if (0 < (int)uVar1) {
    uVar10 = uVar1;
  }
  local_b8 = 1;
  for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
    local_b4 = local_b8;
    for (iVar7 = 0; iVar7 != iVar14; iVar7 = iVar7 + 1) {
      uVar4 = this->downscaling_factor;
      iVar18 = 0;
      uVar12 = 0;
      if (0 < (int)uVar4) {
        uVar12 = (ulong)uVar4;
      }
      iVar13 = (uVar4 * iVar7 + iVar8) * uVar3;
      uVar21 = (ulong)(uVar4 * uVar4 * local_b4);
      for (; iVar18 != iVar9; iVar18 = iVar18 + 1) {
        uVar16 = uVar21;
        iVar15 = iVar13;
        for (uVar19 = 0; uVar19 != uVar12; uVar19 = uVar19 + 1) {
          pfVar6 = (input->super_vector<float,_std::allocator<float>_>).
                   super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
                   ._M_start;
          for (uVar17 = 0; uVar4 != uVar17; uVar17 = uVar17 + 1) {
            tmp.super_vector<float,_std::allocator<float>_>.
            super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
            _M_start[(int)uVar16 + (int)uVar17] = pfVar6[(long)iVar15 + uVar17];
          }
          iVar15 = iVar15 + uVar3;
          uVar16 = uVar16 + uVar4;
        }
        iVar13 = iVar13 + uVar4;
        uVar21 = uVar21 + uVar1;
      }
      local_b4 = local_b4 + iVar20 * uVar1;
    }
    iVar8 = iVar8 + uVar2;
    local_b8 = local_b8 + 1;
  }
  Linear<float>::forward(&this->layer,&tmp,output);
  Tensor<float>::~Tensor(&tmp);
  return;
}

Assistant:

void forward(const Tensor<T> &input, Tensor<T> &output) {
            auto &vec = input.shape;
            int ch_sum = vec[0], h = vec[1], w = vec[2];
            int new_h = h / downscaling_factor, new_w = w / downscaling_factor;
            Tensor<T> tmp{};
            tmp.resize(input.size());
            tmp.shape = {new_h, new_w,
                         (vec[0] * downscaling_factor * downscaling_factor)};
            /*
             * Unfold and reshape
             */
            for (int ch = 0; ch < ch_sum; ++ch) {
                for (int i = 0; i < new_h; ++i) {
                    for (int j = 0; j < new_w; ++j) {
                        for (int x = 0; x < downscaling_factor; ++x) {
                            for (int y = 0; y < downscaling_factor; ++y) {
                                int new_x = ch * downscaling_factor * downscaling_factor + x * downscaling_factor + y;
                                int new_y = i * new_w + j;
                                int tmp_pos = new_x * new_w * new_h + new_y;
                                // Input: C, H, W
                                // Tmp: H*W/(downscaling_size^2), C * downscaling_size^2
                                tmp[i * ch_sum * downscaling_factor * downscaling_factor * new_w + j * ch_sum +
                                    downscaling_factor * downscaling_factor +
                                    ch * downscaling_factor * downscaling_factor + x * downscaling_factor + y] = input[
                                        ch * h * w + (i * downscaling_factor + x) * w + j * downscaling_factor + y];
                            }
                        }
                    }
                }
            }
            layer.forward(tmp, output);
        }